

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

string * __thiscall
Kernel::InferenceStore::TPTPProofPrinter::getNewSymbols
          (string *__return_storage_ptr__,TPTPProofPrinter *this,string *origin,Unit *u)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *pSVar2;
  string *origin_00;
  ConstIterator symIt;
  string local_90;
  undefined1 local_70 [8];
  string local_68;
  string local_48;
  
  Lib::
  DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::find((DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
          *)local_70,&(((this->super_ProofPrinter)._is)->_introducedSplitNames)._timestamp);
  if (local_70 == (undefined1  [8])0x0) {
    pSVar2 = Lib::
             DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::get(&((this->super_ProofPrinter)._is)->_introducedSymbols,u->_number);
    origin_00 = &local_48;
    std::__cxx11::string::string((string *)origin_00,(string *)origin);
    symIt.super_ConstRefIterator._stack = pSVar2;
    symIt.super_ConstRefIterator._pointer = pSVar2->_cursor;
    getNewSymbols<Lib::Stack<std::pair<Kernel::SymbolType,unsigned_int>>::ConstIterator>
              (__return_storage_ptr__,this,origin_00,symIt);
  }
  else {
    std::__cxx11::string::string((string *)(local_70 + 8),(string *)origin);
    pbVar1 = Lib::
             DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::get(&((this->super_ProofPrinter)._is)->_introducedSplitNames,u->_number);
    std::__cxx11::string::string((string *)&local_90,(string *)pbVar1);
    getNewSymbols(__return_storage_ptr__,this,(string *)(local_70 + 8),&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    origin_00 = (string *)(local_70 + 8);
  }
  std::__cxx11::string::~string((string *)origin_00);
  return __return_storage_ptr__;
}

Assistant:

std::string getNewSymbols(std::string origin, Unit* u) {
    ASS(hasNewSymbols(u));

    if(_is->_introducedSplitNames.find(u->number())){
      return getNewSymbols(origin,_is->_introducedSplitNames.get(u->number()));
    }

    SymbolStack& syms = _is->_introducedSymbols.get(u->number());
    return getNewSymbols(origin, SymbolStack::ConstIterator(syms));
  }